

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O1

idx_t duckdb::TernaryExecutor::
      SelectLoop<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t,duckdb::LowerInclusiveBetweenOperator,true,true,false>
                (interval_t *adata,interval_t *bdata,interval_t *cdata,SelectionVector *result_sel,
                idx_t count,SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
                ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  sel_t *psVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  idx_t iVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  
  if (count == 0) {
    iVar9 = 0;
  }
  else {
    psVar1 = result_sel->sel_vector;
    psVar2 = asel->sel_vector;
    psVar3 = bsel->sel_vector;
    psVar4 = csel->sel_vector;
    psVar5 = true_sel->sel_vector;
    iVar9 = 0;
    uVar14 = 0;
    do {
      uVar7 = uVar14;
      if (psVar1 != (sel_t *)0x0) {
        uVar7 = (ulong)psVar1[uVar14];
      }
      uVar8 = uVar14;
      if (psVar2 != (sel_t *)0x0) {
        uVar8 = (ulong)psVar2[uVar14];
      }
      uVar12 = uVar14;
      if (psVar3 != (sel_t *)0x0) {
        uVar12 = (ulong)psVar3[uVar14];
      }
      uVar13 = uVar14;
      if (psVar4 != (sel_t *)0x0) {
        uVar13 = (ulong)psVar4[uVar14];
      }
      lVar16._0_4_ = adata[uVar8].months;
      lVar16._4_4_ = adata[uVar8].days;
      lVar11._0_4_ = bdata[uVar12].months;
      lVar11._4_4_ = bdata[uVar12].days;
      lVar10 = (lVar11 >> 0x20) + bdata[uVar12].micros / 86400000000;
      lVar15 = lVar10 % 0x1e;
      lVar17 = (long)(int)(undefined4)lVar11 + lVar10 / 0x1e;
      lVar11 = (lVar16 >> 0x20) + adata[uVar8].micros / 86400000000;
      lVar10 = adata[uVar8].micros % 86400000000;
      lVar18 = lVar11 % 0x1e;
      lVar16 = (long)(int)(undefined4)lVar16 + lVar11 / 0x1e;
      if (lVar16 < lVar17) {
        uVar8 = 0;
      }
      else {
        lVar6._0_4_ = cdata[uVar13].months;
        lVar6._4_4_ = cdata[uVar13].days;
        if ((lVar17 < lVar16) ||
           ((lVar15 <= lVar18 &&
            ((lVar15 < lVar18 || (bdata[uVar12].micros % 86400000000 <= lVar10)))))) {
          lVar11 = (lVar6 >> 0x20) + cdata[uVar13].micros / 86400000000;
          lVar15 = lVar11 % 0x1e;
          lVar11 = (long)(int)(undefined4)lVar6 + lVar11 / 0x1e;
          uVar8 = 1;
          if (lVar11 <= lVar16) {
            if (lVar11 < lVar16) goto LAB_00ece51e;
            if (lVar15 <= lVar18) {
              uVar8 = (ulong)(lVar10 < cdata[uVar13].micros % 86400000000 && lVar18 <= lVar15);
            }
          }
        }
        else {
LAB_00ece51e:
          uVar8 = 0;
        }
      }
      psVar5[iVar9] = (sel_t)uVar7;
      iVar9 = uVar8 + iVar9;
      uVar14 = uVar14 + 1;
    } while (count != uVar14);
  }
  return iVar9;
}

Assistant:

static inline idx_t SelectLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, const SelectionVector *result_sel, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto aidx = asel.get_index(i);
			auto bidx = bsel.get_index(i);
			auto cidx = csel.get_index(i);
			bool comparison_result =
			    (NO_NULL || (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx))) &&
			    OP::Operation(adata[aidx], bdata[bidx], cdata[cidx]);
			if (HAS_TRUE_SEL) {
				true_sel->set_index(true_count, result_idx);
				true_count += comparison_result;
			}
			if (HAS_FALSE_SEL) {
				false_sel->set_index(false_count, result_idx);
				false_count += !comparison_result;
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}